

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.h
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>::AddElement
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle> *this,TPZCompEl *cel,int64_t meshindex)

{
  int iVar1;
  int64_t iVar2;
  TPZCompElSide *pTVar3;
  long in_RDX;
  TPZManVector<int,_5> *in_RSI;
  TPZVec<TPZCompElSide> *in_RDI;
  TPZCompElSide celside;
  TPZGeoEl *gel;
  int64_t in_stack_ffffffffffffffa8;
  TPZCompEl *in_stack_ffffffffffffffb8;
  int local_40;
  TPZCompElSide local_38;
  TPZGeoEl *local_28;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar2 = TPZVec<TPZCompElSide>::size((TPZVec<TPZCompElSide> *)&in_RDI[3].fNAlloc);
  if (iVar2 <= in_RDX) {
    TPZVec<TPZCompElSide>::resize(in_RDI,in_stack_ffffffffffffffa8);
    TPZManVector<int,_5>::Resize(in_RSI,in_RDX,(int *)CONCAT44(1,in_stack_ffffffffffffffe0));
  }
  if (in_RSI == (TPZManVector<int,_5> *)0x0) {
    TPZCompElSide::TPZCompElSide((TPZCompElSide *)&stack0xffffffffffffffb8);
    pTVar3 = TPZVec<TPZCompElSide>::operator[]((TPZVec<TPZCompElSide> *)&in_RDI[3].fNAlloc,in_RDX);
    pTVar3->fEl = in_stack_ffffffffffffffb8;
    pTVar3->fSide = local_40;
  }
  else {
    local_28 = TPZCompEl::Reference(in_stack_ffffffffffffffb8);
    iVar1 = (**(code **)(*(long *)local_28 + 0xf0))();
    TPZCompElSide::TPZCompElSide(&local_38,(TPZCompEl *)in_RSI,iVar1 + -1);
    pTVar3 = TPZVec<TPZCompElSide>::operator[]((TPZVec<TPZCompElSide> *)&in_RDI[3].fNAlloc,in_RDX);
    pTVar3->fEl = local_38.fEl;
    pTVar3->fSide = local_38.fSide;
  }
  return;
}

Assistant:

virtual void AddElement(TPZCompEl *cel, int64_t meshindex) override
    {
		if (fElementVec.size() <= meshindex) 
		{
			fElementVec.resize(meshindex+1);
            fActiveApproxSpace.Resize(meshindex+1, 1);
		}
        if (cel)
        {
            TPZGeoEl *gel = cel->Reference();
            TPZCompElSide celside(cel,gel->NSides()-1);
            fElementVec[meshindex] = celside;
        }
        else
        {
            fElementVec[meshindex] = TPZCompElSide();
        }
    }